

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O0

NodeResult __thiscall HighsSearch::dive(HighsSearch *this)

{
  bool bVar1;
  NodeResult NVar2;
  HighsHashTable<int,_int> *in_RDI;
  NodeResult result;
  int64_t in_stack_00000040;
  HighsMipSolverData *in_stack_00000048;
  HighsSearch *in_stack_00000108;
  HighsSearch *in_stack_000057a8;
  
  HighsHashTable<int,_int>::clear(in_RDI);
  while( true ) {
    in_RDI[0x15].tableSizeMask = in_RDI[0x15].tableSizeMask + 1;
    NVar2 = evaluateNode(in_stack_00000108);
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x69a5f5)
    ;
    bVar1 = HighsMipSolverData::checkLimits(in_stack_00000048,in_stack_00000040);
    if (bVar1) {
      return NVar2;
    }
    if (NVar2 != kOpen) break;
    NVar2 = branch(in_stack_000057a8);
    if (NVar2 != kBranched) {
      return NVar2;
    }
  }
  return NVar2;
}

Assistant:

HighsSearch::NodeResult HighsSearch::dive() {
  reliableatnode.clear();

  do {
    ++nnodes;
    NodeResult result = evaluateNode();

    if (mipsolver.mipdata_->checkLimits(nnodes)) return result;

    if (result != NodeResult::kOpen) return result;

    result = branch();
    if (result != NodeResult::kBranched) return result;
  } while (true);
}